

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6502Storage.cpp
# Opt level: O2

void __thiscall
CPU::MOS6502::ProcessorStorage::ProcessorStorage(ProcessorStorage *this,Personality personality)

{
  InstructionList *paMVar1;
  InstructionList *paMVar2;
  MicroOp *pMVar3;
  InstructionList *paMVar4;
  ulong uVar5;
  MicroOp MVar6;
  
  this->scheduled_program_counter_ = (MicroOp *)0x0;
  this->s_ = '\0';
  (this->flags_).negative_result = '\0';
  (this->flags_).zero_result = '\0';
  (this->flags_).carry = '\0';
  (this->flags_).carry = '\0';
  (this->flags_).decimal = '\0';
  (this->flags_).overflow = '\0';
  (this->flags_).inverse_interrupt = '\0';
  this->next_bus_operation_ = None;
  this->is_jammed_ = false;
  (this->cycles_left_to_run_).super_WrappedInt<Cycles>.length_ = 0;
  this->interrupt_requests_ = '\x10';
  this->ready_is_active_ = false;
  this->ready_line_is_enabled_ = false;
  this->stop_is_active_ = false;
  this->wait_is_active_ = false;
  this->irq_line_ = '\0';
  this->irq_request_history_ = '\0';
  this->nmi_line_is_enabled_ = false;
  this->set_overflow_line_is_enabled_ = false;
  MVar6 = 1 < (int)personality ^ CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0) + 0) = CycleIncPCPushPCH;
  *(MicroOp *)((long)(this->operations_ + 0) + 1) = CyclePushPCL;
  *(MicroOp *)((long)(this->operations_ + 0) + 2) = OperationBRKPickVector;
  *(MicroOp *)((long)(this->operations_ + 0) + 3) = OperationSetOperandFromFlagsWithBRKSet;
  *(MicroOp *)((long)(this->operations_ + 0) + 4) = CyclePushOperand;
  *(MicroOp *)((long)(this->operations_ + 0) + 5) = OperationSetIRQFlags;
  *(MicroOp *)((long)(this->operations_ + 0) + 6) = CycleReadVectorLow;
  *(MicroOp *)((long)(this->operations_ + 0) + 7) = CycleReadVectorHigh;
  this->operations_[0][8] = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0) + 10) = CycleFetchOperation;
  this->operations_[0][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 1) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 1) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 1) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 1) + 4) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 1) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 1) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 1) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 2) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 2) + 1) = OperationScheduleJam;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 2) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 3) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 3) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 3) + 3) = CycleFetchOperandFromAddress;
  this->operations_[3][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 3) + 5) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 3) + 6) = CycleWriteOperandToAddress;
  this->operations_[3][7] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 3) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 3) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 3) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 3) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 4) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 4) + 1) = CycleFetchOperandFromAddress;
  this->operations_[4][2] = OperationMoveToNextProgram;
  this->operations_[4][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 4) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 4) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 5) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 5) + 2) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 6) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 6) + 1) = CycleFetchOperandFromAddress;
  this->operations_[6][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 6) + 3) = OperationASL;
  *(MicroOp *)((long)(this->operations_ + 6) + 4) = CycleWriteOperandToAddress;
  this->operations_[6][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 7) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 7) + 1) = CycleFetchOperandFromAddress;
  this->operations_[7][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 7) + 3) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 7) + 4) = CycleWriteOperandToAddress;
  this->operations_[7][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 7) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 7) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 8) + 0) = OperationSetOperandFromFlagsWithBRKSet;
  *(MicroOp *)((long)(this->operations_ + 8) + 1) = CyclePushOperand;
  this->operations_[8][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 8) + 10) = CycleFetchOperation;
  this->operations_[8][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 9) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 9) + 1) = OperationORA;
  this->operations_[9][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 9) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 9) + 10) = CycleFetchOperation;
  this->operations_[9][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 10) + 0) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 10) + 1) = OperationASL;
  *(MicroOp *)((long)(this->operations_ + 10) + 2) = OperationCopyOperandToA;
  *(MicroOp *)((long)(this->operations_ + 10) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 10) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 10) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xb) + 1) = OperationANC;
  this->operations_[0xb][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb) + 10) = CycleFetchOperation;
  this->operations_[0xb][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xc) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xc][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc) + 10) = CycleFetchOperation;
  this->operations_[0xc][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xd) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xd) + 2) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 0xd) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xe][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 3) = OperationASL;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xe][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xf][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 3) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xf][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x10) + 0) = OperationBPL;
  *(MicroOp *)((long)(this->operations_ + 0x10) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x10) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x10) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x10) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x11) + 5) = OperationORA;
  this->operations_[0x11][6] = OperationMoveToNextProgram;
  this->operations_[0x11][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x11) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x11) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x11) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x11) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x12) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x12) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x12) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x12) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x12) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 3) = OperationCorrectAddressHigh;
  this->operations_[0x13][4] = CycleFetchOperandFromAddress;
  this->operations_[0x13][5] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 6) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 7) = CycleWriteOperandToAddress;
  this->operations_[0x13][8] = OperationMoveToNextProgram;
  this->operations_[0x13][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x13) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x14) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x14) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x14][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x14) + 10) = CycleFetchOperation;
  this->operations_[0x14][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x15) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x15) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x15) + 2) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 0x15) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x15) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x16][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 3) = OperationASL;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x16][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x16) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x16) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x16) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x16) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x16) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x17][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 3) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x17][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x17) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x17) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x17) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x17) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x17) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x18) + 0) = OperationCLC;
  *(MicroOp *)((long)(this->operations_ + 0x18) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x18) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x18) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x18) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 4) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x19) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x19) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x19) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x19) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x19) + 0xb) = CycleFetchOperation;
  this->operations_[0x1a][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x1b][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 5) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 0x1b) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x1b][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x1b] + 8) = 0x2e2a282400000000;
  this->operations_[0x1c][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 4) = OperationORA;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x1d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x1d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x1d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x1e][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 5) = OperationASL;
  *(MicroOp *)((long)(this->operations_ + 0x1e) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x1e][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x1e] + 8) = 0x2e2a2b2400000000;
  this->operations_[0x1f][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x1f) + 5) = OperationASO;
  *(MicroOp *)((long)(this->operations_ + 0x1f) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x1f][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x1f] + 8) = 0x1e05061c00000000;
  this->operations_[0x20][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 8) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x20) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 4) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x21) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x21) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x21) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x21) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x21) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x22) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x22) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x22) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x22) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x22) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x23][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 5) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x23) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x23][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x23] + 8) = 0x33f2e2500000000;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x24) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x25) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x25) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x25) + 2) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x25) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x25) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x26][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 3) = OperationROL;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x26][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x26) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x26) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x26) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x26) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x26) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x27][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 3) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x27][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x27) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x27) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x27) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x27) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x27) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x28) + 0) = CycleReadFromS;
  *(MicroOp *)((long)(this->operations_ + 0x28) + 1) = CyclePullOperand;
  *(MicroOp *)((long)(this->operations_ + 0x28) + 2) = OperationSetFlagsFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x28) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x28) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x29) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x29) + 1) = OperationAND;
  this->operations_[0x29][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x29) + 10) = CycleFetchOperation;
  this->operations_[0x29][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2a) + 0) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x2a) + 1) = OperationROL;
  *(MicroOp *)((long)(this->operations_ + 0x2a) + 2) = OperationCopyOperandToA;
  *(MicroOp *)((long)(this->operations_ + 0x2a) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2a) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2b) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x2b) + 1) = OperationANC;
  this->operations_[0x2b][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2b) + 10) = CycleFetchOperation;
  this->operations_[0x2b][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2c) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x2c) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x2c) + 2) = OperationBIT;
  *(MicroOp *)((long)(this->operations_ + 0x2c) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2c) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x2d) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x2d) + 2) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x2d) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x2e][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 3) = OperationROL;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x2e][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2e) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2e) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2e) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2e) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2e) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x2f][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 3) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x2f][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x2f) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2f) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2f) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x2f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x2f) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x30) + 0) = OperationBMI;
  *(MicroOp *)((long)(this->operations_ + 0x30) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x30) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x30) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x30) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x31) + 5) = OperationAND;
  this->operations_[0x31][6] = OperationMoveToNextProgram;
  this->operations_[0x31][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x31) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x31) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x31) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x31) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x32) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x32) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x32) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x32) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x32) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 3) = OperationCorrectAddressHigh;
  this->operations_[0x33][4] = CycleFetchOperandFromAddress;
  this->operations_[0x33][5] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 6) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 7) = CycleWriteOperandToAddress;
  this->operations_[0x33][8] = OperationMoveToNextProgram;
  this->operations_[0x33][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x33) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x34) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x34) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x34][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x34) + 10) = CycleFetchOperation;
  this->operations_[0x34][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x35) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x35) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x35) + 2) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x35) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x35) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x36][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 3) = OperationROL;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x36][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x36) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x36) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x36) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x36) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x36) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x37][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 3) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x37][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x37) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x37) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x37) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x37) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x37) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x38) + 0) = OperationSEC;
  *(MicroOp *)((long)(this->operations_ + 0x38) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x38) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x38) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x38) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 4) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x39) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x39) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x39) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x39) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x39) + 0xb) = CycleFetchOperation;
  this->operations_[0x3a][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x3b][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 5) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x3b) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x3b][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x3b] + 8) = 0x2e2a282400000000;
  this->operations_[0x3c][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 4) = OperationAND;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x3d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x3d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x3d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x3e][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 5) = OperationROL;
  *(MicroOp *)((long)(this->operations_ + 0x3e) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x3e][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x3e] + 8) = 0x2e2a2b2400000000;
  this->operations_[0x3f][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x3f) + 5) = OperationRLA;
  *(MicroOp *)((long)(this->operations_ + 0x3f) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x3f][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x3f] + 8) = 0x1484191200000000;
  *(MicroOp *)((long)(this->operations_ + 0x40) + 4) = CyclePullPCH;
  *(MicroOp *)((long)(this->operations_ + 0x40) + 5) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x40) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x40) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x40) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x40) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x40) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x40) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 4) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x41) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x41) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x41) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x41) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x41) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x42) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x42) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x42) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x42) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x42) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x43][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 5) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x43) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x43][7] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x43) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x43) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x43) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x43) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x44) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x44) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x44][2] = OperationMoveToNextProgram;
  this->operations_[0x44][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x44) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x45) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x45) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x45) + 2) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x45) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x45) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x46][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 3) = OperationLSR;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x46][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x46) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x46) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x46) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x46) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x46) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x47][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 3) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x47][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x47) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x47) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x47) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x47) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x47) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x48) + 0) = CyclePushA;
  *(MicroOp *)((long)(this->operations_ + 0x48) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x48) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x48) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x48) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x49) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x49) + 1) = OperationEOR;
  this->operations_[0x49][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x49) + 10) = CycleFetchOperation;
  this->operations_[0x49][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4a) + 0) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x4a) + 1) = OperationLSR;
  *(MicroOp *)((long)(this->operations_ + 0x4a) + 2) = OperationCopyOperandToA;
  *(MicroOp *)((long)(this->operations_ + 0x4a) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4a) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4b) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x4b) + 1) = OperationASR;
  this->operations_[0x4b][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4b) + 10) = CycleFetchOperation;
  this->operations_[0x4b][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4c) + 0) = CycleIncrementPCReadPCHLoadPCL;
  *(MicroOp *)((long)(this->operations_ + 0x4c) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x4c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4c) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x4d) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x4d) + 2) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x4d) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x4e][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 3) = OperationLSR;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x4e][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4e) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4e) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4e) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4e) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4e) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x4f][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 3) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x4f][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x4f) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4f) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4f) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x4f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x4f) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x50) + 0) = OperationBVC;
  *(MicroOp *)((long)(this->operations_ + 0x50) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x50) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x50) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x50) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x51) + 5) = OperationEOR;
  this->operations_[0x51][6] = OperationMoveToNextProgram;
  this->operations_[0x51][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x51) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x51) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x51) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x51) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x52) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x52) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x52) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x52) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x52) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 3) = OperationCorrectAddressHigh;
  this->operations_[0x53][4] = CycleFetchOperandFromAddress;
  this->operations_[0x53][5] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 6) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 7) = CycleWriteOperandToAddress;
  this->operations_[0x53][8] = OperationMoveToNextProgram;
  this->operations_[0x53][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x53) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x54) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x54) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x54][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x54) + 10) = CycleFetchOperation;
  this->operations_[0x54][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x55) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x55) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x55) + 2) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x55) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x55) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x56][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 3) = OperationLSR;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x56][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x56) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x56) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x56) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x56) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x56) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x57][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 3) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x57][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x57) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x57) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x57) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x57) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x57) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x58) + 0) = OperationCLI;
  *(MicroOp *)((long)(this->operations_ + 0x58) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x58) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x58) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x58) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 4) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x59) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x59) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x59) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x59) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x59) + 0xb) = CycleFetchOperation;
  this->operations_[0x5a][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x5b][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 5) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x5b) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x5b][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x5b] + 8) = 0x2e2a282400000000;
  this->operations_[0x5c][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 4) = OperationEOR;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x5d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x5d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x5d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x5e][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 5) = OperationLSR;
  *(MicroOp *)((long)(this->operations_ + 0x5e) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x5e][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x5e] + 8) = 0x2e2a2b2400000000;
  this->operations_[0x5f][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x5f) + 5) = OperationLSE;
  *(MicroOp *)((long)(this->operations_ + 0x5f) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x5f][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x5f] + 8) = 0x1b15141200000000;
  this->operations_[0x60][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x60) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 4) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x61) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x61) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x61) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x61) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x61) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x62) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x62) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x62) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x62) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x62) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 99) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 99) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 99) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 99) + 3) = CycleFetchOperandFromAddress;
  this->operations_[99][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 99) + 5) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 99) + 6) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 99) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 99) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 99) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 99) + 10) = CycleFetchOperation;
  this->operations_[99][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 100) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 100) + 1) = CycleFetchOperandFromAddress;
  this->operations_[100][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 100) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 100) + 10) = CycleFetchOperation;
  this->operations_[100][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x65) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x65) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x65) + 2) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x65) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x65) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x66][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 3) = OperationROR;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x66][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x66) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x66) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x66) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x66) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x66) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x67) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x67) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x67][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 3) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 4) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 6) = OperationMoveToNextProgram;
  this->operations_[0x67][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x67) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x68) + 0) = CycleReadFromS;
  *(MicroOp *)((long)(this->operations_ + 0x68) + 1) = CyclePullA;
  *(MicroOp *)((long)(this->operations_ + 0x68) + 2) = OperationSetFlagsFromA;
  *(MicroOp *)((long)(this->operations_ + 0x68) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x68) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x69) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x69) + 1) = OperationADC;
  this->operations_[0x69][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x69) + 10) = CycleFetchOperation;
  this->operations_[0x69][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6a) + 0) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x6a) + 1) = OperationROR;
  *(MicroOp *)((long)(this->operations_ + 0x6a) + 2) = OperationCopyOperandToA;
  *(MicroOp *)((long)(this->operations_ + 0x6a) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6a) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6b) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x6b) + 1) = OperationARR;
  this->operations_[0x6b][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6b) + 10) = CycleFetchOperation;
  this->operations_[0x6b][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6c) + 0) = CycleReadAddressHLoadAddressL;
  *(MicroOp *)((long)(this->operations_ + 0x6c) + 1) = CycleReadPCLFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x6c) + 2) = CycleReadPCHFromAddressLowInc;
  *(MicroOp *)((long)(this->operations_ + 0x6c) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6c) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x6d) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x6d) + 2) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x6d) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x6e][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 3) = OperationROR;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x6e][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6e) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6e) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6e) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6e) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6e) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x6f) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x6f) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x6f][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 3) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 4) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 6) = OperationMoveToNextProgram;
  this->operations_[0x6f][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x6f) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x70) + 0) = OperationBVS;
  *(MicroOp *)((long)(this->operations_ + 0x70) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x70) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x70) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x70) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x71) + 5) = OperationADC;
  this->operations_[0x71][6] = OperationMoveToNextProgram;
  this->operations_[0x71][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x71) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x71) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x71) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x71) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x72) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x72) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x72) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x72) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x72) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x73) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x73) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x73) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x73) + 3) = OperationCorrectAddressHigh;
  this->operations_[0x73][4] = CycleFetchOperandFromAddress;
  this->operations_[0x73][5] = MVar6;
  *(undefined8 *)(this->operations_[0x73] + 6) = 0x2e260000032f3a57;
  this->operations_[0x74][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x74) + 10) = CycleFetchOperation;
  this->operations_[0x74][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x75) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x75) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x75) + 2) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x75) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x75) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x76][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 3) = OperationROR;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 4) = CycleWriteOperandToAddress;
  this->operations_[0x76][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x76) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x76) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x76) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x76) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x76) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x77) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x77) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0x77][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 3) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 4) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 6) = OperationMoveToNextProgram;
  this->operations_[0x77][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x77) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x78) + 0) = OperationSEI;
  *(MicroOp *)((long)(this->operations_ + 0x78) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x78) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x78) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x78) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 4) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x79) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x79) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x79) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x79) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x79) + 0xb) = CycleFetchOperation;
  this->operations_[0x7a][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x7b][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7b) + 5) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 0x7b) + 6) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 0x7b) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0x7b) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7b) + 10) = CycleFetchOperation;
  this->operations_[0x7b][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7c) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x7c) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x7c) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x7c) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x7c][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 4) = OperationADC;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x7d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0x7e][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 5) = OperationROR;
  *(MicroOp *)((long)(this->operations_ + 0x7e) + 6) = CycleWriteOperandToAddress;
  this->operations_[0x7e][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0x7e] + 8) = 0x2e2a2b2400000000;
  this->operations_[0x7f][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x7f) + 5) = OperationRRA;
  *(MicroOp *)((long)(paMVar4 + 0x7f) + 6) = OperationADC;
  *(MicroOp *)((long)(paMVar4 + 0x7f) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0x7f) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x7f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x7f) + 10) = CycleFetchOperation;
  this->operations_[0x7f][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x80) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x80) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x80) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x80) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x80) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 3) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x81) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x81) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x81) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x81) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x81) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x82) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x82) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x82) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x82) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x82) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 3) = OperationSAX;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x83) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x83) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x83) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x83) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x83) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x84) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x84) + 1) = OperationSTY;
  *(MicroOp *)((long)(this->operations_ + 0x84) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x84) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x84) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x85) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x85) + 1) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x85) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x85) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x85) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x86) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x86) + 1) = OperationSTX;
  *(MicroOp *)((long)(this->operations_ + 0x86) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x86) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x86) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x87) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0x87) + 1) = OperationSAX;
  *(MicroOp *)((long)(this->operations_ + 0x87) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x87) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x87) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x88) + 0) = OperationDEY;
  *(MicroOp *)((long)(this->operations_ + 0x88) + 1) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x88) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x88) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x88) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x89) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x89) + 1) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x89) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x89) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x89) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8a) + 0) = OperationTXA;
  *(MicroOp *)((long)(this->operations_ + 0x8a) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x8a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8b) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x8b) + 1) = OperationANE;
  this->operations_[0x8b][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8b) + 10) = CycleFetchOperation;
  this->operations_[0x8b][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8c) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x8c) + 1) = OperationSTY;
  *(MicroOp *)((long)(this->operations_ + 0x8c) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x8c) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8c) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x8d) + 1) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x8d) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x8d) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x8e) + 1) = OperationSTX;
  *(MicroOp *)((long)(this->operations_ + 0x8e) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x8e) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8e) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x8f) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x8f) + 1) = OperationSAX;
  *(MicroOp *)((long)(this->operations_ + 0x8f) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x8f) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x8f) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x90) + 0) = OperationBCC;
  *(MicroOp *)((long)(this->operations_ + 0x90) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x90) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x90) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x90) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 4) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x91) + 5) = CycleWriteOperandToAddress;
  this->operations_[0x91][6] = OperationMoveToNextProgram;
  this->operations_[0x91][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x91) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x91) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x91) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x91) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x92) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x92) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0x92) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x92) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x92) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 4) = OperationSHA;
  *(MicroOp *)((long)(this->operations_ + 0x93) + 5) = CycleWriteOperandToAddress;
  this->operations_[0x93][6] = OperationMoveToNextProgram;
  this->operations_[0x93][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x93) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x93) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x93) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x93) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x94) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x94) + 1) = OperationSTY;
  *(MicroOp *)((long)(this->operations_ + 0x94) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x94) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x94) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x95) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0x95) + 1) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x95) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x95) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x95) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x96) + 0) = CycleLoadAddessZeroY;
  *(MicroOp *)((long)(this->operations_ + 0x96) + 1) = OperationSTX;
  *(MicroOp *)((long)(this->operations_ + 0x96) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x96) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x96) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x97) + 0) = CycleLoadAddessZeroY;
  *(MicroOp *)((long)(this->operations_ + 0x97) + 1) = OperationSAX;
  *(MicroOp *)((long)(this->operations_ + 0x97) + 2) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x97) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x97) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x98) + 0) = OperationTYA;
  *(MicroOp *)((long)(this->operations_ + 0x98) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x98) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x98) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x98) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 3) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x99) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x99) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x99) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x99) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x99) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9a) + 0) = OperationTXS;
  *(MicroOp *)((long)(this->operations_ + 0x9a) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0x9a) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9a) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9a) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 3) = OperationSHS;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9b) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9b) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9b) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9b) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9b) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 3) = OperationSHY;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9c) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9c) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9c) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9c) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9c) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 3) = OperationSTA;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9d) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9d) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9d) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9d) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9d) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 3) = OperationSHX;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9e) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9e) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9e) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9e) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9e) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 3) = OperationSHA;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 4) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x9f) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9f) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9f) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x9f) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x9f) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa0) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xa0) + 1) = OperationLDY;
  this->operations_[0xa0][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa0) + 10) = CycleFetchOperation;
  this->operations_[0xa0][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 4) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa1) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa1) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa2) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xa2) + 1) = OperationLDX;
  this->operations_[0xa2][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa2) + 10) = CycleFetchOperation;
  this->operations_[0xa2][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 4) = OperationLAX;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa3) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa3) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa3) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa3) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa3) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa4) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xa4) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa4) + 2) = OperationLDY;
  *(MicroOp *)((long)(this->operations_ + 0xa4) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa4) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa5) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xa5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa5) + 2) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xa5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa6) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xa6) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa6) + 2) = OperationLDX;
  *(MicroOp *)((long)(this->operations_ + 0xa6) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa7) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xa7) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xa7) + 2) = OperationLAX;
  *(MicroOp *)((long)(this->operations_ + 0xa7) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa7) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa8) + 0) = OperationTAY;
  *(MicroOp *)((long)(this->operations_ + 0xa8) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xa8) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa8) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xa9) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xa9) + 1) = OperationLDA;
  this->operations_[0xa9][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xa9) + 10) = CycleFetchOperation;
  this->operations_[0xa9][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xaa) + 0) = OperationTAX;
  *(MicroOp *)((long)(this->operations_ + 0xaa) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xaa) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xaa) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaa) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xab) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xab) + 1) = OperationLXA;
  this->operations_[0xab][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xab) + 10) = CycleFetchOperation;
  this->operations_[0xab][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xac) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xac) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xac) + 2) = OperationLDY;
  *(MicroOp *)((long)(this->operations_ + 0xac) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xac) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xad) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xad) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xad) + 2) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xad) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xad) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xae) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xae) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xae) + 2) = OperationLDX;
  *(MicroOp *)((long)(this->operations_ + 0xae) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xae) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xaf) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xaf) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xaf) + 2) = OperationLAX;
  *(MicroOp *)((long)(this->operations_ + 0xaf) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xaf) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb0) + 0) = OperationBCS;
  *(MicroOp *)((long)(this->operations_ + 0xb0) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xb0) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb0) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb1) + 5) = OperationLDA;
  this->operations_[0xb1][6] = OperationMoveToNextProgram;
  this->operations_[0xb1][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb2) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0xb2) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0xb2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb2) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb3) + 5) = OperationLAX;
  this->operations_[0xb3][6] = OperationMoveToNextProgram;
  this->operations_[0xb3][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb3) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb3) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb3) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb3) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb4) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xb4) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb4) + 2) = OperationLDY;
  *(MicroOp *)((long)(this->operations_ + 0xb4) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb4) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb5) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xb5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb5) + 2) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xb5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb6) + 0) = CycleLoadAddessZeroY;
  *(MicroOp *)((long)(this->operations_ + 0xb6) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb6) + 2) = OperationLDX;
  *(MicroOp *)((long)(this->operations_ + 0xb6) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb7) + 0) = CycleLoadAddessZeroY;
  *(MicroOp *)((long)(this->operations_ + 0xb7) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb7) + 2) = OperationLAX;
  *(MicroOp *)((long)(this->operations_ + 0xb7) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb7) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb8) + 0) = OperationCLV;
  *(MicroOp *)((long)(this->operations_ + 0xb8) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xb8) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb8) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 4) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xb9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xb9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xb9) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xba) + 0) = OperationTSX;
  *(MicroOp *)((long)(this->operations_ + 0xba) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xba) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xba) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xba) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 4) = OperationLAS;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xbb) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbb) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbb) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbb) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbb) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 4) = OperationLDY;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xbc) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbc) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbc) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbc) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 4) = OperationLDA;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xbd) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbd) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbd) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbd) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbd) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 4) = OperationLDX;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xbe) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbe) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbe) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbe) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbe) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 4) = OperationLAX;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xbf) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbf) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbf) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xbf) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xbf) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc0) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xc0) + 1) = OperationCPY;
  this->operations_[0xc0][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc0) + 10) = CycleFetchOperation;
  this->operations_[0xc0][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 4) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc1) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc1) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc2) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xc2) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xc2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc2) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xc3][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc3) + 5) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 0xc3) + 6) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 0xc3) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0xc3) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc3) + 10) = CycleFetchOperation;
  this->operations_[0xc3][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc4) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xc4) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xc4) + 2) = OperationCPY;
  *(MicroOp *)((long)(this->operations_ + 0xc4) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc4) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc5) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xc5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xc5) + 2) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xc5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xc6][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 3) = OperationDEC;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xc6][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 199) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 199) + 1) = CycleFetchOperandFromAddress;
  this->operations_[199][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 199) + 3) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 199) + 4) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 199) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 199) + 6) = OperationMoveToNextProgram;
  this->operations_[199][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 199) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 199) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 199) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 199) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 200) + 0) = OperationINY;
  *(MicroOp *)((long)(this->operations_ + 200) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 200) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 200) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 200) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 200) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xc9) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xc9) + 1) = OperationCMP;
  this->operations_[0xc9][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xc9) + 10) = CycleFetchOperation;
  this->operations_[0xc9][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xca) + 0) = OperationDEX;
  *(MicroOp *)((long)(this->operations_ + 0xca) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xca) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xca) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xca) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xcb) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xcb) + 1) = OperationSBX;
  this->operations_[0xcb][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcb) + 10) = CycleFetchOperation;
  this->operations_[0xcb][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xcc) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xcc) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xcc) + 2) = OperationCPY;
  *(MicroOp *)((long)(this->operations_ + 0xcc) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcc) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xcd) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xcd) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xcd) + 2) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xcd) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcd) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xce][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 3) = OperationDEC;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xce][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xce) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xce) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xce) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xce) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xce) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xcf) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xcf) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xcf][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 3) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 4) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 6) = OperationMoveToNextProgram;
  this->operations_[0xcf][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xcf) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd0) + 0) = OperationBNE;
  *(MicroOp *)((long)(this->operations_ + 0xd0) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xd0) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd0) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xd1) + 5) = OperationCMP;
  this->operations_[0xd1][6] = OperationMoveToNextProgram;
  this->operations_[0xd1][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd2) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0xd2) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0xd2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd2) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xd3) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xd3) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xd3) + 3) = OperationCorrectAddressHigh;
  this->operations_[0xd3][4] = CycleFetchOperandFromAddress;
  this->operations_[0xd3][5] = MVar6;
  *(undefined8 *)(this->operations_[0xd3] + 6) = 0x2e260000032f3c33;
  this->operations_[0xd4][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd4) + 10) = CycleFetchOperation;
  this->operations_[0xd4][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd5) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xd5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xd5) + 2) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xd5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xd6][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 3) = OperationDEC;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xd6][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd7) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xd7) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xd7][2] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 3) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 4) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 5) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 6) = OperationMoveToNextProgram;
  this->operations_[0xd7][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd8) + 0) = OperationCLD;
  *(MicroOp *)((long)(this->operations_ + 0xd8) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xd8) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd8) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 4) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xd9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xd9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xd9) + 0xb) = CycleFetchOperation;
  this->operations_[0xda][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xda) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xdb][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xdb) + 5) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 0xdb) + 6) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 0xdb) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0xdb) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdb) + 10) = CycleFetchOperation;
  this->operations_[0xdb][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdc) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xdc) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xdc) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xdc) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xdc][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 4) = OperationCMP;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xdd) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdd) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdd) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xdd) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdd) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xde][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 5) = OperationDEC;
  *(MicroOp *)((long)(this->operations_ + 0xde) + 6) = CycleWriteOperandToAddress;
  this->operations_[0xde][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0xde] + 8) = 0x2e2a2b2400000000;
  this->operations_[0xdf][4] = MVar6;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xdf) + 5) = OperationDecrementOperand;
  *(MicroOp *)((long)(paMVar4 + 0xdf) + 6) = OperationCMP;
  *(MicroOp *)((long)(paMVar4 + 0xdf) + 7) = CycleWriteOperandToAddress;
  *(MicroOp *)((long)(paMVar4 + 0xdf) + 8) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xdf) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xdf) + 10) = CycleFetchOperation;
  this->operations_[0xdf][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe0) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xe0) + 1) = OperationCPX;
  this->operations_[0xe0][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe0) + 10) = CycleFetchOperation;
  this->operations_[0xe0][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 4) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe1) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe1) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe2) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xe2) + 1) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe2) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 1) = CycleAddXToOperandFetchAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 2) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xe3][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 5) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xe3) + 6) = CycleWriteOperandToAddress;
  this->operations_[0xe3][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0xe3] + 8) = 0x33d2e2500000000;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe4) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe5) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xe5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xe5) + 2) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xe5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xe6][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 3) = OperationINC;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xe6][5] = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe6) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 0) = OperationLoadAddressZeroPage;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xe7][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 3) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xe7][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe7) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe7) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe8) + 0) = OperationINX;
  *(MicroOp *)((long)(this->operations_ + 0xe8) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xe8) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe8) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xe9) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xe9) + 1) = OperationSBC;
  this->operations_[0xe9][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xe9) + 10) = CycleFetchOperation;
  this->operations_[0xe9][0xb] = CycleFetchOperation;
  this->operations_[0xea][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xea) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xeb) + 0) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0xeb) + 1) = OperationSBC;
  this->operations_[0xeb][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xeb) + 10) = CycleFetchOperation;
  this->operations_[0xeb][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xec) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xec) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xec) + 2) = OperationCPX;
  *(MicroOp *)((long)(this->operations_ + 0xec) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xec) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xed) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xed) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xed) + 2) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xed) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xed) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xee][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 3) = OperationINC;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xee][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xee) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xee) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xee) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xee) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xee) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xef][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 3) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xef][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xef) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xef) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xef) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xef) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xef) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf0) + 0) = OperationBEQ;
  *(MicroOp *)((long)(this->operations_ + 0xf0) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xf0) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf0) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf0) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 2) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 3) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 4) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xf1) + 5) = OperationSBC;
  this->operations_[0xf1][6] = OperationMoveToNextProgram;
  this->operations_[0xf1][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf1) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf1) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf1) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf1) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf2) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0xf2) + 1) = OperationScheduleJam;
  *(MicroOp *)((long)(this->operations_ + 0xf2) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf2) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf2) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 0) = CycleIncrementPCFetchAddressLowFromOperand;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 1) = CycleIncrementOperandFetchAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 2) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 3) = OperationCorrectAddressHigh;
  this->operations_[0xf3][4] = CycleFetchOperandFromAddress;
  this->operations_[0xf3][5] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 6) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 7) = CycleWriteOperandToAddress;
  this->operations_[0xf3][8] = OperationMoveToNextProgram;
  this->operations_[0xf3][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf3) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf4) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xf4) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xf4][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf4) + 10) = CycleFetchOperation;
  this->operations_[0xf4][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf5) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xf5) + 1) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xf5) + 2) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xf5) + 3) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf5) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xf6][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 3) = OperationINC;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xf6][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf6) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf6) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf6) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf6) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf6) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 0) = CycleLoadAddessZeroX;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 1) = CycleFetchOperandFromAddress;
  this->operations_[0xf7][2] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 3) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 4) = CycleWriteOperandToAddress;
  this->operations_[0xf7][5] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf7) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf7) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf7) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf7) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf7) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf8) + 0) = OperationSED;
  *(MicroOp *)((long)(this->operations_ + 0xf8) + 1) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(this->operations_ + 0xf8) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf8) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf8) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 1) = CycleAddYToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 4) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xf9) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf9) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf9) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xf9) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xf9) + 0xb) = CycleFetchOperation;
  this->operations_[0xfa][0] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 1) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 2) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfa) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 1) = CycleAddYToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xfb][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 5) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xfb) + 6) = CycleWriteOperandToAddress;
  this->operations_[0xfb][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0xfb] + 8) = 0x2e2a282400000000;
  this->operations_[0xfc][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfc) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 1) = CycleAddXToAddressLow;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 3) = CycleFetchOperandFromAddress;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 4) = OperationSBC;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 5) = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xfd) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfd) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfd) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xfd) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xfd) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 0) = CycleLoadAddressAbsolute;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 1) = CycleAddXToAddressLowRead;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 2) = OperationCorrectAddressHigh;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 3) = CycleFetchOperandFromAddress;
  this->operations_[0xfe][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 5) = OperationINC;
  *(MicroOp *)((long)(this->operations_ + 0xfe) + 6) = CycleWriteOperandToAddress;
  this->operations_[0xfe][7] = OperationMoveToNextProgram;
  *(undefined8 *)(this->operations_[0xfe] + 8) = 0x2e2a2b2400000000;
  this->operations_[0xff][4] = MVar6;
  *(MicroOp *)((long)(this->operations_ + 0xff) + 5) = OperationINS;
  *(MicroOp *)((long)(this->operations_ + 0xff) + 6) = CycleWriteOperandToAddress;
  this->operations_[0xff][7] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0xff) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xff) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xff) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0xff) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x100) + 0) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x100) + 1) = CycleFetchOperand;
  this->operations_[0x100][2] = OperationDecodeOperation;
  this->operations_[0x100][0xb] = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x100) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 1) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 2) = CycleNoWritePush;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 3) = CycleNoWritePush;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 4) = OperationRSTPickVector;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 5) = CycleNoWritePush;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 6) = OperationSetNMIRSTFlags;
  *(MicroOp *)((long)(this->operations_ + 0x101) + 7) = CycleReadVectorLow;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x101) + 8) = CycleReadVectorHigh;
  *(MicroOp *)((long)(paMVar4 + 0x101) + 9) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(paMVar4 + 0x101) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x101) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 1) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 2) = CyclePushPCH;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 3) = CyclePushPCL;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 4) = OperationBRKPickVector;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 5) = OperationSetOperandFromFlags;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 6) = CyclePushOperand;
  *(MicroOp *)((long)(this->operations_ + 0x102) + 7) = OperationSetIRQFlags;
  *(undefined8 *)(this->operations_[0x102] + 8) = 0x506010100031110;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 4) = OperationNMIPickVector;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 5) = OperationSetOperandFromFlags;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 6) = CyclePushOperand;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 7) = OperationSetNMIRSTFlags;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 8) = CycleReadVectorLow;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 9) = CycleReadVectorHigh;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 10) = OperationMoveToNextProgram;
  *(MicroOp *)((long)(paMVar4 + 0x103) + 0xb) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x104) + 0) = CycleReadFromPC;
  *(MicroOp *)((long)(this->operations_ + 0x104) + 1) = CycleAddSignedOperandToPC;
  this->operations_[0x104][2] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 3) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x104) + 10) = CycleFetchOperation;
  this->operations_[0x104][0xb] = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x105) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x105) + 1) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x105) + 2) = CycleFetchFromHalfUpdatedPC;
  *(MicroOp *)((long)(this->operations_ + 0x105) + 3) = OperationAddSignedOperandToPC16;
  this->operations_[0x105][4] = OperationMoveToNextProgram;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 4) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x106) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 9) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 10) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 0xb) = CycleFetchOperation;
  paMVar4 = this->operations_;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 5) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 6) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 7) = CycleFetchOperation;
  *(MicroOp *)((long)(paMVar4 + 0x105) + 8) = CycleFetchOperation;
  *(MicroOp *)((long)(this->operations_ + 0x106) + 0) = CycleFetchOperand;
  *(MicroOp *)((long)(this->operations_ + 0x106) + 1) = OperationIncrementPC;
  *(MicroOp *)((long)(this->operations_ + 0x106) + 2) = CycleFetchFromHalfUpdatedPC;
  *(MicroOp *)((long)(this->operations_ + 0x106) + 3) = OperationMoveToNextProgram;
  if (1 < (int)personality) {
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x5a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 0) = CyclePushY;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xda) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xda) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xda) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xda) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 0) = CyclePushX;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x7a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 0) = CycleReadFromS;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 1) = CyclePullY;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 2) = OperationSetFlagsFromY;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xfa) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xfa) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xfa) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xfa) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 0) = CycleReadFromS;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 1) = CyclePullX;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 2) = OperationSetFlagsFromX;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x80) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x80) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x80) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x80) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 0) = OperationBRA;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 7) = CycleFetchOperation;
    paMVar1 = this->operations_ + 0xcb;
    paMVar2 = this->operations_ + 0xdb;
    paMVar4 = this->operations_ + 3;
    for (uVar5 = 3; uVar5 < 0xf4; uVar5 = uVar5 + 0x10) {
      *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
      paMVar4 = paMVar4 + 0x10;
    }
    paMVar4 = this->operations_ + 0xb;
    for (uVar5 = 0xb; uVar5 < 0xbc; uVar5 = uVar5 + 0x10) {
      *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
      paMVar4 = paMVar4 + 0x10;
    }
    paMVar4 = this->operations_ + 0xeb;
    for (uVar5 = 0xeb; uVar5 < 0xfc; uVar5 = uVar5 + 0x10) {
      *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
      paMVar4 = paMVar4 + 0x10;
    }
    paMVar4 = this->operations_ + 2;
    for (uVar5 = 2; uVar5 < 99; uVar5 = uVar5 + 0x10) {
      *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 0) = OperationIncrementPC;
      *(MicroOp *)((long)paMVar4 + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar4 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
      paMVar4 = paMVar4 + 0x10;
    }
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 0) = CycleReadAddressHLoadAddressL;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 1) = CycleReadPCLFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 2) = CycleReadPCHFromAddressLowInc;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 3) = CycleReadPCHFromAddressFixed;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 4) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x6c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x6c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x6c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x6c) + 0xb) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x7c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 0) = CycleReadAddressHLoadAddressL;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 1) = CycleAddXToAddressLowRead;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 3) = CycleReadPCLFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 4) = CycleReadPCHFromAddressInc;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x1a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 0) = OperationINA;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x3a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 0) = OperationDEA;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x12) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x12) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x12) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x12) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 4) = OperationORA;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 4) = OperationAND;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x32) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x32) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x32) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x32) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 4) = OperationEOR;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x52) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x52) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x52) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x52) + 0xb) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x72) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x72) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x72) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x72) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 4) = OperationADC;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x92) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x92) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x92) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x92) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 3) = OperationSTA;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 4) = OperationLDA;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xb2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xb2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xb2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xb2) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 4) = OperationCMP;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xd2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xd2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xd2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xd2) + 0xb) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xf2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xf2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xf2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xf2) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 4) = OperationSBC;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x9c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 1) = CycleAddXToAddressLowRead;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 3) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x9e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x9e) + 0xb) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 100) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 100) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 100) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 100) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 100) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 100) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 100) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 100) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x74) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x74) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x74) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x74) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 0) = CycleLoadAddessZeroX;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x34) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x34) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x34) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x34) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 0) = CycleLoadAddessZeroX;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 2) = OperationBIT;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x3c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 4) = OperationBIT;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 7) = CycleFetchOperation;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x89) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x89) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x89) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x89) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 0) = OperationIncrementPC;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 1) = OperationBITNoNV;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 2) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 4) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 4) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 4) + 2) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 4) + 3) = OperationTSB;
    *(MicroOp *)((long)(this->operations_ + 4) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 4) + 5) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 4) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 4) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 4) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 4) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 4) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 4) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 2) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 3) = OperationTSB;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 5) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0xc) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xc) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xc) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0xc) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xc) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 2) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 3) = OperationTRB;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 5) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x14) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x14) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x14) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x14) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x14) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 2) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 3) = OperationTRB;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 5) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x1c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1c) + 7) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 5) = OperationASL;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1e) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x1e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1e) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 5) = OperationASO;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x1f) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x1f) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1f) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1f) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x1f) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 5) = OperationROL;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3e) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x3e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3e) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 5) = OperationRLA;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3f) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x3f) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3f) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3f) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x3f) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 5) = OperationLSR;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5e) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x5e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5e) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 5) = OperationLSE;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x5f) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x5f) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5f) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5f) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x5f) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 5) = OperationROR;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 6) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7e) + 7) = OperationMoveToNextProgram;
    paMVar4 = this->operations_;
    *(MicroOp *)((long)(paMVar4 + 0x7e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar4 + 0x7e) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 4) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 5) = OperationRRA;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 6) = OperationADC;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 7) = CycleWriteOperandToAddress;
    this->operations_[0x7f][8] = OperationMoveToNextProgram;
    this->operations_[0x7f][0xb] = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7f) + 10) = CycleFetchOperation;
    if (personality == PSynertek65C02) {
      paMVar4 = this->operations_ + 0xf;
      for (uVar5 = 0xf; uVar5 < 0xf0; uVar5 = uVar5 + 0x20) {
        *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0) = CycleLoadAddressAbsolute;
        *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar4 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
        paMVar4 = paMVar4 + 0x20;
      }
      paMVar4 = this->operations_ + 0x1f;
      for (uVar5 = 0x1f; uVar5 < 0x100; uVar5 = uVar5 + 0x20) {
        *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0) = CycleLoadAddressAbsolute;
        *(MicroOp *)((long)paMVar4 + 1) = CycleAddXToAddressLow;
        *(MicroOp *)((long)paMVar4 + 2) = OperationCorrectAddressHigh;
        *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar4 + 4) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
        paMVar4 = paMVar4 + 0x20;
      }
      paMVar4 = this->operations_ + 7;
      for (uVar5 = 7; uVar5 < 0xe8; uVar5 = uVar5 + 0x20) {
        *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0) = OperationLoadAddressZeroPage;
        *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar4 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
        paMVar4 = paMVar4 + 0x20;
      }
      paMVar4 = this->operations_ + 0x17;
      for (uVar5 = 0x17; uVar5 < 0xf8; uVar5 = uVar5 + 0x20) {
        *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0) = CycleLoadAddessZeroX;
        *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar4 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar4 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
        paMVar4 = paMVar4 + 0x20;
      }
    }
    else {
      paMVar4 = this->operations_ + 0xf;
      for (uVar5 = 0xf; uVar5 < 0x100; uVar5 = uVar5 + 0x10) {
        *(MicroOp *)((long)paMVar4 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0xb) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 0) = OperationLoadAddressZeroPage;
        *(MicroOp *)((long)paMVar4 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar4 + 2) = OperationBBRBBS;
        *(MicroOp *)((long)paMVar4 + 3) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar4 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar4 + 7) = CycleFetchOperation;
        paMVar4 = paMVar4 + 0x10;
      }
      pMVar3 = this->operations_[7] + 6;
      for (uVar5 = 7; uVar5 < 0x78; uVar5 = uVar5 + 0x10) {
        pMVar3[-6] = OperationLoadAddressZeroPage;
        pMVar3[-5] = CycleFetchOperandFromAddress;
        pMVar3[-4] = CycleFetchOperandFromAddress;
        pMVar3[-3] = OperationRMB;
        pMVar3[-2] = CycleWriteOperandToAddress;
        pMVar3[-1] = OperationMoveToNextProgram;
        pMVar3[0] = CycleFetchOperation;
        pMVar3[1] = CycleFetchOperation;
        pMVar3[2] = CycleFetchOperation;
        pMVar3[3] = CycleFetchOperation;
        pMVar3[4] = CycleFetchOperation;
        pMVar3[5] = CycleFetchOperation;
        pMVar3 = pMVar3 + 0xc0;
      }
      pMVar3 = this->operations_[0x87] + 6;
      for (uVar5 = 0x87; uVar5 < 0xf8; uVar5 = uVar5 + 0x10) {
        pMVar3[-6] = OperationLoadAddressZeroPage;
        pMVar3[-5] = CycleFetchOperandFromAddress;
        pMVar3[-4] = CycleFetchOperandFromAddress;
        pMVar3[-3] = OperationSMB;
        pMVar3[-2] = CycleWriteOperandToAddress;
        pMVar3[-1] = OperationMoveToNextProgram;
        pMVar3[0] = CycleFetchOperation;
        pMVar3[1] = CycleFetchOperation;
        pMVar3[2] = CycleFetchOperation;
        pMVar3[3] = CycleFetchOperation;
        pMVar3[4] = CycleFetchOperation;
        pMVar3[5] = CycleFetchOperation;
        pMVar3 = pMVar3 + 0xc0;
      }
    }
    if ((int)personality < 4) {
      paMVar4 = this->operations_;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar1 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 7) = CycleFetchOperation;
      paMVar4 = this->operations_;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0) = CycleLoadAddessZeroX;
      *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperandFromAddress;
      *(MicroOp *)((long)paMVar2 + 2) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
    }
    else {
      paMVar4 = this->operations_;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xcb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 0) = OperationScheduleWait;
      *(MicroOp *)((long)paMVar1 + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar1 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar1 + 7) = CycleFetchOperation;
      paMVar4 = this->operations_;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar4 + 0xdb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0) = OperationScheduleStop;
      *(MicroOp *)((long)paMVar2 + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
    }
  }
  return;
}

Assistant:

ProcessorStorage::ProcessorStorage(Personality personality) {
	const InstructionList operations_6502[] = {
		/* 0x00 BRK */			Program(CycleIncPCPushPCH, CyclePushPCL, OperationBRKPickVector, OperationSetOperandFromFlagsWithBRKSet, CyclePushOperand, OperationSetIRQFlags, CycleReadVectorLow, CycleReadVectorHigh),
		/* 0x01 ORA x, ind */	IndexedIndirectRead(OperationORA),
		/* 0x02 JAM */			JAM,																	/* 0x03 ASO x, ind */	IndexedIndirectReadModifyWrite(OperationASO),
		/* 0x04 NOP zpg */		ZeroNop(),																/* 0x05 ORA zpg */		ZeroRead(OperationORA),
		/* 0x06 ASL zpg */		ZeroReadModifyWrite(OperationASL),										/* 0x07 ASO zpg */		ZeroReadModifyWrite(OperationASO),
		/* 0x08 PHP */			Program(OperationSetOperandFromFlagsWithBRKSet, CyclePushOperand),
		/* 0x09 ORA # */		Immediate(OperationORA),
		/* 0x0a ASL A */		Implied(OperationASL),													/* 0x0b ANC # */		Immediate(OperationANC),
		/* 0x0c NOP abs */		AbsoluteNop(),															/* 0x0d ORA abs */		AbsoluteRead(OperationORA),
		/* 0x0e ASL abs */		AbsoluteReadModifyWrite(OperationASL),									/* 0x0f ASO abs */		AbsoluteReadModifyWrite(OperationASO),
		/* 0x10 BPL */			Program(OperationBPL),													/* 0x11 ORA ind, y */	IndirectIndexedRead(OperationORA),
		/* 0x12 JAM */			JAM,																	/* 0x13 ASO ind, y */	IndirectIndexedReadModifyWrite(OperationASO),
		/* 0x14 NOP zpg, x */	ZeroXNop(),																/* 0x15 ORA zpg, x */	ZeroXRead(OperationORA),
		/* 0x16 ASL zpg, x */	ZeroXReadModifyWrite(OperationASL),										/* 0x17 ASO zpg, x */	ZeroXReadModifyWrite(OperationASO),
		/* 0x18 CLC */			Program(OperationCLC),													/* 0x19 ORA abs, y */	AbsoluteYRead(OperationORA),
		/* 0x1a NOP # */		ImpliedNop(),															/* 0x1b ASO abs, y */	AbsoluteYReadModifyWrite(OperationASO),
		/* 0x1c NOP abs, x */	AbsoluteXNop(),															/* 0x1d ORA abs, x */	AbsoluteXRead(OperationORA),
		/* 0x1e ASL abs, x */	AbsoluteXReadModifyWrite(OperationASL),									/* 0x1f ASO abs, x */	AbsoluteXReadModifyWrite(OperationASO),
		/* 0x20 JSR abs */		Program(CycleIncrementPCAndReadStack, CyclePushPCH, CyclePushPCL, CycleReadPCHLoadPCL),
		/* 0x21 AND x, ind */	IndexedIndirectRead(OperationAND),
		/* 0x22 JAM */			JAM,																	/* 0x23 RLA x, ind */	IndexedIndirectReadModifyWrite(OperationRLA),
		/* 0x24 BIT zpg */		ZeroRead(OperationBIT),													/* 0x25 AND zpg */		ZeroRead(OperationAND),
		/* 0x26 ROL zpg */		ZeroReadModifyWrite(OperationROL),										/* 0x27 RLA zpg */		ZeroReadModifyWrite(OperationRLA),
		/* 0x28 PLP */			Program(CycleReadFromS, CyclePullOperand, OperationSetFlagsFromOperand),
		/* 0x29 AND A # */		Immediate(OperationAND),
		/* 0x2a ROL A */		Implied(OperationROL),													/* 0x2b ANC # */		Immediate(OperationANC),
		/* 0x2c BIT abs */		AbsoluteRead(OperationBIT),												/* 0x2d AND abs */		AbsoluteRead(OperationAND),
		/* 0x2e ROL abs */		AbsoluteReadModifyWrite(OperationROL),									/* 0x2f RLA abs */		AbsoluteReadModifyWrite(OperationRLA),
		/* 0x30 BMI */			Program(OperationBMI),													/* 0x31 AND ind, y */	IndirectIndexedRead(OperationAND),
		/* 0x32 JAM */			JAM,																	/* 0x33 RLA ind, y */	IndirectIndexedReadModifyWrite(OperationRLA),
		/* 0x34 NOP zpg, x */	ZeroXNop(),																/* 0x35 AND zpg, x */	ZeroXRead(OperationAND),
		/* 0x36 ROL zpg, x */	ZeroXReadModifyWrite(OperationROL),										/* 0x37 RLA zpg, x */	ZeroXReadModifyWrite(OperationRLA),
		/* 0x38 SEC */			Program(OperationSEC),													/* 0x39 AND abs, y */	AbsoluteYRead(OperationAND),
		/* 0x3a NOP # */		ImpliedNop(),															/* 0x3b RLA abs, y */	AbsoluteYReadModifyWrite(OperationRLA),
		/* 0x3c NOP abs, x */	AbsoluteXNop(),															/* 0x3d AND abs, x */	AbsoluteXRead(OperationAND),
		/* 0x3e ROL abs, x */	AbsoluteXReadModifyWrite(OperationROL),									/* 0x3f RLA abs, x */	AbsoluteXReadModifyWrite(OperationRLA),
		/* 0x40 RTI */			Program(CycleReadFromS, CyclePullOperand, OperationSetFlagsFromOperand, CyclePullPCL, CyclePullPCH),
		/* 0x41 EOR x, ind */	IndexedIndirectRead(OperationEOR),
		/* 0x42 JAM */			JAM,																	/* 0x43 LSE x, ind */	IndexedIndirectReadModifyWrite(OperationLSE),
		/* 0x44 NOP zpg */		ZeroNop(),																/* 0x45 EOR zpg */		ZeroRead(OperationEOR),
		/* 0x46 LSR zpg */		ZeroReadModifyWrite(OperationLSR),										/* 0x47 LSE zpg */		ZeroReadModifyWrite(OperationLSE),
		/* 0x48 PHA */			Program(CyclePushA),													/* 0x49 EOR # */		Immediate(OperationEOR),
		/* 0x4a LSR A */		Implied(OperationLSR),													/* 0x4b ASR A */		Immediate(OperationASR),
		/* 0x4c JMP abs */		Program(CycleIncrementPCReadPCHLoadPCL),								/* 0x4d EOR abs */		AbsoluteRead(OperationEOR),
		/* 0x4e LSR abs */		AbsoluteReadModifyWrite(OperationLSR),									/* 0x4f LSE abs */		AbsoluteReadModifyWrite(OperationLSE),
		/* 0x50 BVC */			Program(OperationBVC),													/* 0x51 EOR ind, y */	IndirectIndexedRead(OperationEOR),
		/* 0x52 JAM */			JAM,																	/* 0x53 LSE ind, y */	IndirectIndexedReadModifyWrite(OperationLSE),
		/* 0x54 NOP zpg, x */	ZeroXNop(),																/* 0x55 EOR zpg, x */	ZeroXRead(OperationEOR),
		/* 0x56 LSR zpg, x */	ZeroXReadModifyWrite(OperationLSR),										/* 0x57 LSE zpg, x */	ZeroXReadModifyWrite(OperationLSE),
		/* 0x58 CLI */			Program(OperationCLI),													/* 0x59 EOR abs, y */	AbsoluteYRead(OperationEOR),
		/* 0x5a NOP # */		ImpliedNop(),															/* 0x5b LSE abs, y */	AbsoluteYReadModifyWrite(OperationLSE),
		/* 0x5c NOP abs, x */	AbsoluteXNop(),															/* 0x5d EOR abs, x */	AbsoluteXRead(OperationEOR),
		/* 0x5e LSR abs, x */	AbsoluteXReadModifyWrite(OperationLSR),									/* 0x5f LSE abs, x */	AbsoluteXReadModifyWrite(OperationLSE),
		/* 0x60 RTS */			Program(CycleReadFromS, CyclePullPCL, CyclePullPCH, CycleReadAndIncrementPC),
		/* 0x61 ADC x, ind */	IndexedIndirectRead(OperationADC),
		/* 0x62 JAM */			JAM,																	/* 0x63 RRA x, ind */	IndexedIndirectReadModifyWrite(OperationRRA, OperationADC),
		/* 0x64 NOP zpg */		ZeroNop(),																/* 0x65 ADC zpg */		ZeroRead(OperationADC),
		/* 0x66 ROR zpg */		ZeroReadModifyWrite(OperationROR),										/* 0x67 RRA zpg */		ZeroReadModifyWrite(OperationRRA, OperationADC),
		/* 0x68 PLA */			Program(CycleReadFromS, CyclePullA, OperationSetFlagsFromA),			/* 0x69 ADC # */		Immediate(OperationADC),
		/* 0x6a ROR A */		Implied(OperationROR),													/* 0x6b ARR # */		Immediate(OperationARR),
		/* 0x6c JMP (abs) */	Program(CycleReadAddressHLoadAddressL, CycleReadPCLFromAddress, CycleReadPCHFromAddressLowInc),
		/* 0x6d ADC abs */		AbsoluteRead(OperationADC),
		/* 0x6e ROR abs */		AbsoluteReadModifyWrite(OperationROR),									/* 0x6f RRA abs */		AbsoluteReadModifyWrite(OperationRRA, OperationADC),
		/* 0x70 BVS */			Program(OperationBVS),													/* 0x71 ADC ind, y */	IndirectIndexedRead(OperationADC),
		/* 0x72 JAM */			JAM,																	/* 0x73 RRA ind, y */	IndirectIndexedReadModifyWrite(OperationRRA, OperationADC),
		/* 0x74 NOP zpg, x */	ZeroXNop(),																/* 0x75 ADC zpg, x */	ZeroXRead(OperationADC),
		/* 0x76 ROR zpg, x */	ZeroXReadModifyWrite(OperationROR),										/* 0x77 RRA zpg, x */	ZeroXReadModifyWrite(OperationRRA, OperationADC),
		/* 0x78 SEI */			Program(OperationSEI),													/* 0x79 ADC abs, y */	AbsoluteYRead(OperationADC),
		/* 0x7a NOP # */		ImpliedNop(),															/* 0x7b RRA abs, y */	AbsoluteYReadModifyWrite(OperationRRA, OperationADC),
		/* 0x7c NOP abs, x */	AbsoluteXNop(),															/* 0x7d ADC abs, x */	AbsoluteXRead(OperationADC),
		/* 0x7e ROR abs, x */	AbsoluteXReadModifyWrite(OperationROR),									/* 0x7f RRA abs, x */	AbsoluteXReadModifyWrite(OperationRRA, OperationADC),
		/* 0x80 NOP # */		ImmediateNop(),															/* 0x81 STA x, ind */	IndexedIndirectWrite(OperationSTA),
		/* 0x82 NOP # */		ImmediateNop(),															/* 0x83 SAX x, ind */	IndexedIndirectWrite(OperationSAX),
		/* 0x84 STY zpg */		ZeroWrite(OperationSTY),												/* 0x85 STA zpg */		ZeroWrite(OperationSTA),
		/* 0x86 STX zpg */		ZeroWrite(OperationSTX),												/* 0x87 SAX zpg */		ZeroWrite(OperationSAX),
		/* 0x88 DEY */			Program(OperationDEY),													/* 0x89 NOP # */		ImmediateNop(),
		/* 0x8a TXA */			Program(OperationTXA),													/* 0x8b ANE # */		Immediate(OperationANE),
		/* 0x8c STY abs */		AbsoluteWrite(OperationSTY),											/* 0x8d STA abs */		AbsoluteWrite(OperationSTA),
		/* 0x8e STX abs */		AbsoluteWrite(OperationSTX),											/* 0x8f SAX abs */		AbsoluteWrite(OperationSAX),
		/* 0x90 BCC */			Program(OperationBCC),													/* 0x91 STA ind, y */	IndirectIndexedWrite(OperationSTA),
		/* 0x92 JAM */			JAM,																	/* 0x93 SHA ind, y */	IndirectIndexedWrite(OperationSHA),
		/* 0x94 STY zpg, x */	ZeroXWrite(OperationSTY),												/* 0x95 STA zpg, x */	ZeroXWrite(OperationSTA),
		/* 0x96 STX zpg, y */	ZeroYWrite(OperationSTX),												/* 0x97 SAX zpg, y */	ZeroYWrite(OperationSAX),
		/* 0x98 TYA */			Program(OperationTYA),													/* 0x99 STA abs, y */	AbsoluteYWrite(OperationSTA),
		/* 0x9a TXS */			Program(OperationTXS),													/* 0x9b SHS abs, y */	AbsoluteYWrite(OperationSHS),
		/* 0x9c SHY abs, x */	AbsoluteXWrite(OperationSHY),											/* 0x9d STA abs, x */	AbsoluteXWrite(OperationSTA),
		/* 0x9e SHX abs, y */	AbsoluteYWrite(OperationSHX),											/* 0x9f SHA abs, y */	AbsoluteYWrite(OperationSHA),
		/* 0xa0 LDY # */		Immediate(OperationLDY),												/* 0xa1 LDA x, ind */	IndexedIndirectRead(OperationLDA),
		/* 0xa2 LDX # */		Immediate(OperationLDX),												/* 0xa3 LAX x, ind */	IndexedIndirectRead(OperationLAX),
		/* 0xa4 LDY zpg */		ZeroRead(OperationLDY),													/* 0xa5 LDA zpg */		ZeroRead(OperationLDA),
		/* 0xa6 LDX zpg */		ZeroRead(OperationLDX),													/* 0xa7 LAX zpg */		ZeroRead(OperationLAX),
		/* 0xa8 TAY */			Program(OperationTAY),													/* 0xa9 LDA # */		Immediate(OperationLDA),
		/* 0xaa TAX */			Program(OperationTAX),													/* 0xab LXA # */		Immediate(OperationLXA),
		/* 0xac LDY abs */		AbsoluteRead(OperationLDY),												/* 0xad LDA abs */		AbsoluteRead(OperationLDA),
		/* 0xae LDX abs */		AbsoluteRead(OperationLDX),												/* 0xaf LAX abs */		AbsoluteRead(OperationLAX),
		/* 0xb0 BCS */			Program(OperationBCS),													/* 0xb1 LDA ind, y */	IndirectIndexedRead(OperationLDA),
		/* 0xb2 JAM */			JAM,																	/* 0xb3 LAX ind, y */	IndirectIndexedRead(OperationLAX),
		/* 0xb4 LDY zpg, x */	ZeroXRead(OperationLDY),												/* 0xb5 LDA zpg, x */	ZeroXRead(OperationLDA),
		/* 0xb6 LDX zpg, y */	ZeroYRead(OperationLDX),												/* 0xb7 LAX zpg, x */	ZeroYRead(OperationLAX),
		/* 0xb8 CLV */			Program(OperationCLV),													/* 0xb9 LDA abs, y */	AbsoluteYRead(OperationLDA),
		/* 0xba TSX */			Program(OperationTSX),													/* 0xbb LAS abs, y */	AbsoluteYRead(OperationLAS),
		/* 0xbc LDY abs, x */	AbsoluteXRead(OperationLDY),											/* 0xbd LDA abs, x */	AbsoluteXRead(OperationLDA),
		/* 0xbe LDX abs, y */	AbsoluteYRead(OperationLDX),											/* 0xbf LAX abs, y */	AbsoluteYRead(OperationLAX),
		/* 0xc0 CPY # */		Immediate(OperationCPY),												/* 0xc1 CMP x, ind */	IndexedIndirectRead(OperationCMP),
		/* 0xc2 NOP # */		ImmediateNop(),															/* 0xc3 DCP x, ind */	IndexedIndirectReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xc4 CPY zpg */		ZeroRead(OperationCPY),													/* 0xc5 CMP zpg */		ZeroRead(OperationCMP),
		/* 0xc6 DEC zpg */		ZeroReadModifyWrite(OperationDEC),										/* 0xc7 DCP zpg */		ZeroReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xc8 INY */			Program(OperationINY),													/* 0xc9 CMP # */		Immediate(OperationCMP),
		/* 0xca DEX */			Program(OperationDEX),													/* 0xcb ARR # */		Immediate(OperationSBX),
		/* 0xcc CPY abs */		AbsoluteRead(OperationCPY),												/* 0xcd CMP abs */		AbsoluteRead(OperationCMP),
		/* 0xce DEC abs */		AbsoluteReadModifyWrite(OperationDEC),									/* 0xcf DCP abs */		AbsoluteReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd0 BNE */			Program(OperationBNE),													/* 0xd1 CMP ind, y */	IndirectIndexedRead(OperationCMP),
		/* 0xd2 JAM */			JAM,																	/* 0xd3 DCP ind, y */	IndirectIndexedReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd4 NOP zpg, x */	ZeroXNop(),																/* 0xd5 CMP zpg, x */	ZeroXRead(OperationCMP),
		/* 0xd6 DEC zpg, x */	ZeroXReadModifyWrite(OperationDEC),										/* 0xd7 DCP zpg, x */	ZeroXReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd8 CLD */			Program(OperationCLD),													/* 0xd9 CMP abs, y */	AbsoluteYRead(OperationCMP),
		/* 0xda NOP # */		ImpliedNop(),															/* 0xdb DCP abs, y */	AbsoluteYReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xdc NOP abs, x */	AbsoluteXNop(),															/* 0xdd CMP abs, x */	AbsoluteXRead(OperationCMP),
		/* 0xde DEC abs, x */	AbsoluteXReadModifyWrite(OperationDEC),									/* 0xdf DCP abs, x */	AbsoluteXReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xe0 CPX # */		Immediate(OperationCPX),												/* 0xe1 SBC x, ind */	IndexedIndirectRead(OperationSBC),
		/* 0xe2 NOP # */		ImmediateNop(),															/* 0xe3 INS x, ind */	IndexedIndirectReadModifyWrite(OperationINS),
		/* 0xe4 CPX zpg */		ZeroRead(OperationCPX),													/* 0xe5 SBC zpg */		ZeroRead(OperationSBC),
		/* 0xe6 INC zpg */		ZeroReadModifyWrite(OperationINC),										/* 0xe7 INS zpg */		ZeroReadModifyWrite(OperationINS),
		/* 0xe8 INX */			Program(OperationINX),													/* 0xe9 SBC # */		Immediate(OperationSBC),
		/* 0xea NOP # */		ImpliedNop(),															/* 0xeb SBC # */		Immediate(OperationSBC),
		/* 0xec CPX abs */		AbsoluteRead(OperationCPX),												/* 0xed SBC abs */		AbsoluteRead(OperationSBC),
		/* 0xee INC abs */		AbsoluteReadModifyWrite(OperationINC),									/* 0xef INS abs */		AbsoluteReadModifyWrite(OperationINS),
		/* 0xf0 BEQ */			Program(OperationBEQ),													/* 0xf1 SBC ind, y */	IndirectIndexedRead(OperationSBC),
		/* 0xf2 JAM */			JAM,																	/* 0xf3 INS ind, y */	IndirectIndexedReadModifyWrite(OperationINS),
		/* 0xf4 NOP zpg, x */	ZeroXNop(),																/* 0xf5 SBC zpg, x */	ZeroXRead(OperationSBC),
		/* 0xf6 INC zpg, x */	ZeroXReadModifyWrite(OperationINC),										/* 0xf7 INS zpg, x */	ZeroXReadModifyWrite(OperationINS),
		/* 0xf8 SED */			Program(OperationSED),													/* 0xf9 SBC abs, y */	AbsoluteYRead(OperationSBC),
		/* 0xfa NOP # */		ImpliedNop(),															/* 0xfb INS abs, y */	AbsoluteYReadModifyWrite(OperationINS),
		/* 0xfc NOP abs, x */	AbsoluteXNop(),															/* 0xfd SBC abs, x */	AbsoluteXRead(OperationSBC),
		/* 0xfe INC abs, x */	AbsoluteXReadModifyWrite(OperationINC),									/* 0xff INS abs, x */	AbsoluteXReadModifyWrite(OperationINS),

		/* 0x100: Fetch, decode, execute. */
		{
			CycleFetchOperation,
			CycleFetchOperand,
			OperationDecodeOperation
		},

		/* 0x101: Reset. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CycleNoWritePush,
			CycleNoWritePush,
			OperationRSTPickVector,
			CycleNoWritePush,
			OperationSetNMIRSTFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x102: IRQ. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CyclePushPCH,
			CyclePushPCL,
			OperationBRKPickVector,
			OperationSetOperandFromFlags,
			CyclePushOperand,
			OperationSetIRQFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x103: NMI. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CyclePushPCH,
			CyclePushPCL,
			OperationNMIPickVector,
			OperationSetOperandFromFlags,
			CyclePushOperand,
			OperationSetNMIRSTFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x104: Do BRA. */
		Program(
			CycleReadFromPC,
			CycleAddSignedOperandToPC
		),

		/* 0x105: Do BBR or BBS. */
		Program(
			CycleFetchOperand,				// Fetch offset.
			OperationIncrementPC,
			CycleFetchFromHalfUpdatedPC,
			OperationAddSignedOperandToPC16
		),

		/* 0x106: Complete BBR or BBS without branching. */
		Program(
			CycleFetchOperand,
			OperationIncrementPC,
			CycleFetchFromHalfUpdatedPC
		)
	};

	static_assert(sizeof(operations_6502) == sizeof(operations_));

	// Install the basic 6502 table.
	memcpy(operations_, operations_6502, sizeof(operations_));

	// Patch the table according to the chip's personality.
	//
	// The 6502 and NES 6502 both have the same mapping of operation codes to actions
	// (respect for the decimal mode flag aside); included in that are 'unofficial'
	// operations — spots that are not formally defined to do anything but which the
	// processor makes no particular effort to react to in a well-defined way.
	//
	// The 65C02s add some official instructions but also ensure that all of the
	// undefined ones act as no-ops of various addressing modes.
	//
	// So the branch below has to add a bunch of new actions but also removes various
	// others by dint of replacing them with NOPs.
	//
	// Those 6502 opcodes that need redefining, one way or the other, are:
	//
	// 0x02, 0x03, 0x04, 0x07, 0x0b, 0x0c, 0x0f, 0x12, 0x13, 0x14, 0x17, 0x1a, 0x1b, 0x1c, 0x1f,
	// 0x22, 0x23, 0x27, 0x2b, 0x2f, 0x32, 0x33, 0x34, 0x37, 0x3a, 0x3b, 0x3c, 0x3f,
	// 0x42, 0x43, 0x47, 0x4b, 0x4f, 0x52, 0x53, 0x57, 0x5a, 0x5b, 0x5f,
	// 0x62, 0x63, 0x64, 0x67, 0x6b, 0x6f, 0x72, 0x73, 0x74, 0x77, 0x7b, 0x7a, 0x7c, 0x7f,
	// 0x80, 0x82, 0x83, 0x87, 0x89, 0x8b, 0x8f, 0x92, 0x93, 0x97, 0x9b, 0x9e, 0x9c, 0x9f,
	// 0xa3, 0xa7, 0xab, 0xaf, 0xb2, 0xb3, 0xb7, 0xbb, 0xbf,
	// 0xc3, 0xc7, 0xcb, 0xcf, 0xd2, 0xd3, 0xd7, 0xda, 0xdb, 0xdf,
	// 0xe3, 0xe7, 0xeb, 0xef, 0xf2, 0xf3, 0xf7, 0xfa, 0xfb, 0xff
	//
	// ... not including those that aren't defined on the 6502 but perform NOPs exactly like they
	// would on a 65C02.

#define Install(location, instructions) {\
		const InstructionList code = instructions;	\
		memcpy(&operations_[location], code, sizeof(InstructionList));	\
	}
	if(is_65c02(personality)) {
		// Add P[L/H][X/Y].
		Install(0x5a, Program(CyclePushY));
		Install(0xda, Program(CyclePushX));
		Install(0x7a, Program(CycleReadFromS, CyclePullY, OperationSetFlagsFromY));
		Install(0xfa, Program(CycleReadFromS, CyclePullX, OperationSetFlagsFromX));

		// Add BRA.
		Install(0x80, Program(OperationBRA));

		// The 1-byte, 1-cycle (!) NOPs.
		for(int c = 0x03; c <= 0xf3; c += 0x10) {
			Install(c, ImpliedNop());
		}
		for(int c = 0x0b; c <= 0xbb; c += 0x10) {
			Install(c, ImpliedNop());
		}
		for(int c = 0xeb; c <= 0xfb; c += 0x10) {
			Install(c, ImpliedNop());
		}

		// The 2-byte, 2-cycle NOPs that the 6502 doesn't have.
		for(int c = 0x02; c <= 0x62; c += 0x10) {
			Install(c, ImmediateNop());
		}

		// Correct JMP (abs) and install JMP (abs, x).
		//
		// Guess: JMP (abs, x), being listed at a fixed 6 cycles, uses the slower abs,x of INC and DEC.
		Install(0x6c, Program(CycleReadAddressHLoadAddressL, CycleReadPCLFromAddress, CycleReadPCHFromAddressLowInc, CycleReadPCHFromAddressFixed));
		Install(0x7c, Program(
			CycleReadAddressHLoadAddressL,	// (3) read second byte of (addr)
			CycleAddXToAddressLowRead,
			OperationCorrectAddressHigh,	// (4) read from incorrectly-calculated address
			CycleReadPCLFromAddress,		// (5) read from real (addr+x)
			CycleReadPCHFromAddressInc		// (6) read from addr+x+1
		));

		// Add INA and DEA.
		Install(0x1a, Program(OperationINA));
		Install(0x3a, Program(OperationDEA));

		// Add (zp) operations.
		Install(0x12, ZeroIndirectRead(OperationORA));
		Install(0x32, ZeroIndirectRead(OperationAND));
		Install(0x52, ZeroIndirectRead(OperationEOR));
		Install(0x72, ZeroIndirectRead(OperationADC));
		Install(0x92, ZeroIndirectWrite(OperationSTA));
		Install(0xb2, ZeroIndirectRead(OperationLDA));
		Install(0xd2, ZeroIndirectRead(OperationCMP));
		Install(0xf2, ZeroIndirectRead(OperationSBC));

		// Add STZ.
		Install(0x9c, AbsoluteWrite(OperationSTZ));
		Install(0x9e, AbsoluteXWrite(OperationSTZ));
		Install(0x64, ZeroWrite(OperationSTZ));
		Install(0x74, ZeroXWrite(OperationSTZ));

		// Add the extra BITs.
		Install(0x34, ZeroXRead(OperationBIT));
		Install(0x3c, AbsoluteXRead(OperationBIT));
		Install(0x89, Immediate(OperationBITNoNV));

		// Add TRB and TSB.
		Install(0x04, ZeroReadModifyWrite(OperationTSB));
		Install(0x0c, AbsoluteReadModifyWrite(OperationTSB));
		Install(0x14, ZeroReadModifyWrite(OperationTRB));
		Install(0x1c, AbsoluteReadModifyWrite(OperationTRB));

		// Install faster ASL, LSR, ROL, ROR abs,[x/y]. Note: INC, DEC deliberately not improved.
		Install(0x1e, FastAbsoluteXReadModifyWrite(OperationASL));
		Install(0x1f, FastAbsoluteXReadModifyWrite(OperationASO));
		Install(0x3e, FastAbsoluteXReadModifyWrite(OperationROL));
		Install(0x3f, FastAbsoluteXReadModifyWrite(OperationRLA));
		Install(0x5e, FastAbsoluteXReadModifyWrite(OperationLSR));
		Install(0x5f, FastAbsoluteXReadModifyWrite(OperationLSE));
		Install(0x7e, FastAbsoluteXReadModifyWrite(OperationROR));
		Install(0x7f, FastAbsoluteXReadModifyWrite(OperationRRA, OperationADC));

		// Outstanding:
		// 0x07, 0x0f, 0x17, 0x1f,
		// 0x27, 0x2f, 0x37, 0x3f,
		// 0x47, 0x4f, 0x57, 0x5f,
		// 0x67, 0x6f, 0x77, 0x7f,
		// 0x87, 0x8f, 0x97, 0x9f,
		// 0xa7, 0xaf, 0xb7, 0xbf,
		// 0xc7, 0xcb, 0xcf, 0xd7, 0xdb, 0xdf,
		// 0xe7, 0xef, 0xf7, 0xff
		if(has_bbrbbsrmbsmb(personality)) {
			// Add BBS and BBR. These take five cycles. My guessed breakdown is:
			// 1. read opcode
			// 2. read operand
			// 3. read zero page
			// 4. read second operand
			// 5. read from PC without top byte fixed yet
			// ... with the caveat that (3) and (4) could be the other way around.
			for(int location = 0x0f; location <= 0xff; location += 0x10) {
				Install(location, Program(OperationLoadAddressZeroPage, CycleFetchOperandFromAddress, OperationBBRBBS));
			}

			// Add RMB and SMB.
			for(int c = 0x07; c <= 0x77; c += 0x10) {
				Install(c, ZeroReadModifyWrite(OperationRMB));
			}
			for(int c = 0x87; c <= 0xf7; c += 0x10) {
				Install(c, ZeroReadModifyWrite(OperationSMB));
			}
		} else {
			for(int location = 0x0f; location <= 0xef; location += 0x20) {
				Install(location, AbsoluteNop());
			}
			for(int location = 0x1f; location <= 0xff; location += 0x20) {
				Install(location, AbsoluteXNop());
			}
			for(int c = 0x07; c <= 0xe7; c += 0x20) {
				Install(c, ZeroNop());
			}
			for(int c = 0x17; c <= 0xf7; c += 0x20) {
				Install(c, ZeroXNop());
			}
		}

		// Outstanding:
		// 0xcb, 0xdb,
		if(has_stpwai(personality)) {
			Install(0xcb, Program(OperationScheduleWait));
			Install(0xdb, Program(OperationScheduleStop));
		} else {
			Install(0xcb, ImpliedNop());
			Install(0xdb, ZeroXNop());
		}
	}
#undef Install
}